

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvodes_ls.c
# Opt level: O3

int CVodeSetJacFnBS(void *cvode_mem,int which,CVLsJacFnBS jacBS)

{
  int iVar1;
  code *jac;
  CVLsMemB cvlsB_mem;
  CVodeBMem cvB_mem;
  CVadjMem ca_mem;
  CVodeMem cv_mem;
  CVLsMemB local_28;
  CVodeBMem local_20;
  CVadjMem local_18;
  CVodeMem local_10;
  
  iVar1 = cvLs_AccessLMemB(cvode_mem,which,"CVodeSetJacFnBS",&local_10,&local_18,&local_20,&local_28
                          );
  if (iVar1 != 0) {
    return iVar1;
  }
  local_28->jacBS = jacBS;
  if (jacBS == (CVLsJacFnBS)0x0) {
    jac = (CVLsJacFn)0x0;
  }
  else {
    jac = cvLsJacBSWrapper;
  }
  iVar1 = CVodeSetJacFn(local_20->cv_mem,jac);
  return iVar1;
}

Assistant:

int CVodeSetJacFnBS(void* cvode_mem, int which, CVLsJacFnBS jacBS)
{
  CVodeMem cv_mem;
  CVadjMem ca_mem;
  CVodeBMem cvB_mem;
  CVLsMemB cvlsB_mem;
  void* cvodeB_mem;
  int retval;

  /* access relevant memory structures */
  retval = cvLs_AccessLMemB(cvode_mem, which, __func__, &cv_mem, &ca_mem,
                            &cvB_mem, &cvlsB_mem);
  if (retval != CVLS_SUCCESS) { return (retval); }

  /* set jacBS function pointer */
  cvlsB_mem->jacBS = jacBS;

  /* call corresponding routine for cvodeB_mem structure */
  cvodeB_mem = (void*)(cvB_mem->cv_mem);
  if (jacBS != NULL) { retval = CVodeSetJacFn(cvodeB_mem, cvLsJacBSWrapper); }
  else { retval = CVodeSetJacFn(cvodeB_mem, NULL); }

  return (retval);
}